

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

void expect_memory_setup(char *function,char *parameter,char *file,int line,void *memory,size_t size
                        ,CheckParameterValue check_function,int count)

{
  void *event;
  
  event = malloc(size + 0x38);
  if (memory == (void *)0x0) {
    cm_print_error("%s\n","memory");
    _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O1/_deps/cmocka-src/src/cmocka.c"
          ,0x644);
  }
  if (size != 0) {
    memcpy((void *)((long)event + 0x38),memory,size);
    *(void **)((long)event + 0x28) = (void *)((long)event + 0x38);
    *(size_t *)((long)event + 0x30) = size;
    _expect_check(function,parameter,file,line,check_function,(unsigned_long)event,
                  (CheckParameterEvent *)event,count);
    return;
  }
  cm_print_error("%s\n","size");
  _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O1/_deps/cmocka-src/src/cmocka.c"
        ,0x645);
}

Assistant:

static void expect_memory_setup(
        const char* const function, const char* const parameter,
        const char* const file, const int line,
        const void * const memory, const size_t size,
        const CheckParameterValue check_function, const int count) {
    CheckMemoryData * const check_data =
        (CheckMemoryData*)malloc(sizeof(*check_data) + size);
    void * const mem = (void*)(check_data + 1);
    declare_initialize_value_pointer_pointer(check_data_pointer, check_data);
    assert_non_null(memory);
    assert_true(size);
    memcpy(mem, memory, size);
    check_data->memory = mem;
    check_data->size = size;
    _expect_check(function, parameter, file, line, check_function,
                  check_data_pointer.value, &check_data->event, count);
}